

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> __thiscall
libtorrent::aux::http_parser::header_duration(http_parser *this,string_view key)

{
  bool bVar1;
  char *__nptr;
  duration<int,_std::ratio<1L,_1L>_> local_50 [2];
  long local_48;
  long val;
  _Self local_38;
  _Self local_30;
  const_iterator i;
  http_parser *this_local;
  string_view key_local;
  
  key_local._M_len = (size_t)key._M_str;
  this_local = (http_parser *)key._M_len;
  i._M_node = (_Base_ptr)this;
  local_30._M_node =
       (_Base_ptr)
       ::std::
       multimap<std::__cxx11::string,std::__cxx11::string,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
       ::find<std::basic_string_view<char,std::char_traits<char>>>
                 ((multimap<std::__cxx11::string,std::__cxx11::string,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   *)&this->m_header,(basic_string_view<char,_std::char_traits<char>_> *)&this_local
                 );
  local_38._M_node =
       (_Base_ptr)
       ::std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_header);
  bVar1 = ::std::operator==(&local_30,&local_38);
  if (bVar1) {
    ::std::optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>::optional
              ((optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> *)&key_local._M_str);
  }
  else {
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_30);
    __nptr = (char *)::std::__cxx11::string::c_str();
    local_48 = atol(__nptr);
    if (local_48 < 1) {
      ::std::optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>::optional
                ((optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> *)&key_local._M_str);
    }
    else {
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<long,void>
                ((duration<int,std::ratio<1l,1l>> *)local_50,&local_48);
      ::std::optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>::
      optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true>
                ((optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> *)&key_local._M_str,
                 local_50);
    }
  }
  return (_Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>)
         (_Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>)
         key_local._M_str;
}

Assistant:

std::optional<seconds32> http_parser::header_duration(string_view const key) const
	{
		// at least GCC-5.4 for ARM (on travis) has a libstdc++ whose debug map$
		// doesn't seem to support transparent comparators$
#if ! defined _GLIBCXX_DEBUG
		auto const i = m_header.find(key);
#else
		auto const i = m_header.find(std::string(key));
#endif
		if (i == m_header.end()) return std::nullopt;
		auto const val = std::atol(i->second.c_str());
		if (val <= 0) return std::nullopt;
		return seconds32(val);
	}